

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

LinearIndex * __thiscall CoreML::Specification::LinearIndex::New(LinearIndex *this,Arena *arena)

{
  LinearIndex *this_00;
  LinearIndex *n;
  Arena *arena_local;
  LinearIndex *this_local;
  
  this_00 = (LinearIndex *)operator_new(0x18);
  LinearIndex(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::LinearIndex>(arena,this_00);
  }
  return this_00;
}

Assistant:

LinearIndex* LinearIndex::New(::google::protobuf::Arena* arena) const {
  LinearIndex* n = new LinearIndex;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}